

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

char __thiscall
duckdb::WindowQuantileState<signed_char>::WindowScalar<signed_char,true>
          (WindowQuantileState<signed_char> *this,CursorType *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  bool bVar1;
  pointer this_00;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  InternalException *this_01;
  long in_RDI;
  IndexError *idx_err;
  array<signed_char,_2UL> dest;
  Interpolator<true> interp;
  char *in_stack_fffffffffffffee8;
  Interpolator<true> *in_stack_fffffffffffffef0;
  allocator *paVar5;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  char cVar6;
  Interpolator<true> *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  Vector *in_stack_ffffffffffffff30;
  idx_t in_stack_ffffffffffffff38;
  SubFrames *in_stack_ffffffffffffff40;
  QuantileCursor<signed_char> *in_stack_ffffffffffffff48;
  QuantileSortTree *in_stack_ffffffffffffff50;
  allocator local_99;
  string local_98 [151];
  char local_1;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
                      *)0x9fc1d9);
  if (bVar1) {
    unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>::
    operator->((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
                *)in_stack_fffffffffffffef0);
    local_1 = QuantileSortTree::WindowScalar<signed_char,signed_char,true>
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                         in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         in_stack_ffffffffffffff30,
                         (QuantileValue *)
                         CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                        *)0x9fc233);
    if (!bVar1) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      paVar5 = &local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"No accelerator for scalar QUANTILE",paVar5);
      duckdb::InternalException::InternalException(this_01,local_98);
      __cxa_throw(this_01,&InternalException::typeinfo,InternalException::~InternalException);
    }
    this_00 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>,_true>
              ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>,_true>
                            *)in_stack_fffffffffffffef0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
    ::size(this_00);
    Interpolator<true>::Interpolator
              (in_stack_ffffffffffffff00,
               (QuantileValue *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
               (idx_t)in_stack_fffffffffffffef0,SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
    unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>,_true>
    ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>,_true>
                  *)in_stack_fffffffffffffef0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
    ::at(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00,
         (vector<std::pair<unsigned_long,_signed_char>,_std::allocator<std::pair<unsigned_long,_signed_char>_>_>
          *)CONCAT17(in_stack_fffffffffffffeff,
                     CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
    pvVar2 = vector<std::pair<unsigned_long,_signed_char>,_true>::operator[]
                       ((vector<std::pair<unsigned_long,_signed_char>,_true> *)
                        in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
    cVar6 = pvVar2->second;
    pvVar3 = std::array<signed_char,_2UL>::operator[]
                       ((array<signed_char,_2UL> *)in_stack_fffffffffffffef0,
                        (size_type)in_stack_fffffffffffffee8);
    *pvVar3 = cVar6;
    sVar4 = std::
            vector<std::pair<unsigned_long,_signed_char>,_std::allocator<std::pair<unsigned_long,_signed_char>_>_>
            ::size((vector<std::pair<unsigned_long,_signed_char>,_std::allocator<std::pair<unsigned_long,_signed_char>_>_>
                    *)(in_RDI + 0x28));
    if (sVar4 < 2) {
      pvVar2 = vector<std::pair<unsigned_long,_signed_char>,_true>::operator[]
                         ((vector<std::pair<unsigned_long,_signed_char>,_true> *)
                          in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
      cVar6 = pvVar2->second;
      pvVar3 = std::array<signed_char,_2UL>::operator[]
                         ((array<signed_char,_2UL> *)in_stack_fffffffffffffef0,
                          (size_type)in_stack_fffffffffffffee8);
      *pvVar3 = cVar6;
    }
    else {
      pvVar2 = vector<std::pair<unsigned_long,_signed_char>,_true>::operator[]
                         ((vector<std::pair<unsigned_long,_signed_char>,_true> *)
                          in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
      cVar6 = pvVar2->second;
      pvVar3 = std::array<signed_char,_2UL>::operator[]
                         ((array<signed_char,_2UL> *)in_stack_fffffffffffffef0,
                          (size_type)in_stack_fffffffffffffee8);
      *pvVar3 = cVar6;
    }
    std::array<signed_char,_2UL>::data((array<signed_char,_2UL> *)0x9fc439);
    local_1 = Interpolator<true>::Extract<signed_char,signed_char>
                        (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(Vector *)0x9fc451);
  }
  return local_1;
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}